

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SyntaxNode *args_3;
  BinaryPropertyExprSyntax *pBVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                      (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryPropertyExprSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,(PropertyExprSyntax *)args_1
                      ,&local_30,(PropertyExprSyntax *)args_3);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryPropertyExprSyntax>(
        node.kind,
        *deepClone<PropertyExprSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.right, alloc)
    );
}